

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalGenerator::FillExtensionToLanguageMap(cmGlobalGenerator *this,string *l,cmMakefile *mf)

{
  string *psVar1;
  mapped_type *pmVar2;
  cmList *__range1;
  string *i;
  pointer __k;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmList extensionList;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string extensionsVar;
  
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[24]>
            (&extensionsVar,(char (*) [7])0x72f1a0,l,(char (*) [24])"_SOURCE_FILE_EXTENSIONS");
  psVar1 = cmMakefile::GetSafeDefinition(mf,&extensionsVar);
  std::__cxx11::string::string((string *)&local_60,(string *)psVar1);
  init._M_len = 1;
  init._M_array = &local_60;
  cmList::cmList(&extensionList,init);
  std::__cxx11::string::~string((string *)&local_60);
  for (__k = extensionList.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
      __k != extensionList.Values.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish; __k = __k + 1) {
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->ExtensionToLanguage,__k);
    std::__cxx11::string::_M_assign((string *)pmVar2);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&extensionList.Values);
  std::__cxx11::string::~string((string *)&extensionsVar);
  return;
}

Assistant:

void cmGlobalGenerator::FillExtensionToLanguageMap(const std::string& l,
                                                   cmMakefile* mf)
{
  std::string extensionsVar = cmStrCat("CMAKE_", l, "_SOURCE_FILE_EXTENSIONS");
  const std::string& exts = mf->GetSafeDefinition(extensionsVar);
  cmList extensionList{ exts };
  for (std::string const& i : extensionList) {
    this->ExtensionToLanguage[i] = l;
  }
}